

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::UniformInfiniteLight,pbrt::Transform_const&,pbrt::DenselySampledSpectrum_const*,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,UniformInfiniteLight *p,Transform *args,
          DenselySampledSpectrum **args_1,float *args_2,polymorphic_allocator<std::byte> *args_3)

{
  Float FVar1;
  Allocator alloc;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  long in_FS_OFFSET;
  SpectrumHandle local_10;
  
  FVar1 = *args_2;
  local_10.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )((ulong)*args_1 | 0x2000000000000);
  alloc.memoryResource = args_3->memoryResource;
  (p->super_LightBase).type = Infinite;
  uVar2 = *(undefined8 *)((args->mInv).m[0] + 2);
  uVar3 = *(undefined8 *)(args->mInv).m[1];
  uVar4 = *(undefined8 *)((args->mInv).m[1] + 2);
  uVar5 = *(undefined8 *)(args->mInv).m[2];
  uVar6 = *(undefined8 *)((args->mInv).m[2] + 2);
  uVar7 = *(undefined8 *)(args->mInv).m[3];
  uVar8 = *(undefined8 *)((args->mInv).m[3] + 2);
  uVar9 = *(undefined8 *)(args->m).m[0];
  uVar10 = *(undefined8 *)((args->m).m[0] + 2);
  uVar11 = *(undefined8 *)(args->m).m[1];
  uVar12 = *(undefined8 *)((args->m).m[1] + 2);
  uVar13 = *(undefined8 *)(args->m).m[2];
  uVar14 = *(undefined8 *)((args->m).m[2] + 2);
  uVar15 = *(undefined8 *)(args->m).m[3];
  uVar16 = *(undefined8 *)((args->m).m[3] + 2);
  *(undefined8 *)(p->super_LightBase).renderFromLight.mInv.m[0] = *(undefined8 *)(args->mInv).m[0];
  *(undefined8 *)((p->super_LightBase).renderFromLight.mInv.m[0] + 2) = uVar2;
  *(undefined8 *)(p->super_LightBase).renderFromLight.mInv.m[1] = uVar3;
  *(undefined8 *)((p->super_LightBase).renderFromLight.mInv.m[1] + 2) = uVar4;
  *(undefined8 *)(p->super_LightBase).renderFromLight.mInv.m[2] = uVar5;
  *(undefined8 *)((p->super_LightBase).renderFromLight.mInv.m[2] + 2) = uVar6;
  *(undefined8 *)(p->super_LightBase).renderFromLight.mInv.m[3] = uVar7;
  *(undefined8 *)((p->super_LightBase).renderFromLight.mInv.m[3] + 2) = uVar8;
  *(undefined8 *)(p->super_LightBase).renderFromLight.m.m[0] = uVar9;
  *(undefined8 *)((p->super_LightBase).renderFromLight.m.m[0] + 2) = uVar10;
  *(undefined8 *)(p->super_LightBase).renderFromLight.m.m[1] = uVar11;
  *(undefined8 *)((p->super_LightBase).renderFromLight.m.m[1] + 2) = uVar12;
  *(undefined8 *)(p->super_LightBase).renderFromLight.m.m[2] = uVar13;
  *(undefined8 *)((p->super_LightBase).renderFromLight.m.m[2] + 2) = uVar14;
  *(undefined8 *)(p->super_LightBase).renderFromLight.m.m[3] = uVar15;
  *(undefined8 *)((p->super_LightBase).renderFromLight.m.m[3] + 2) = uVar16;
  (p->super_LightBase).mediumInterface.inside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (p->super_LightBase).mediumInterface.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  *(long *)(in_FS_OFFSET + -0x240) = *(long *)(in_FS_OFFSET + -0x240) + 1;
  pbrt::DenselySampledSpectrum::DenselySampledSpectrum(&p->Lemit,&local_10,0x168,0x33e,alloc);
  p->scale = FVar1;
  (p->sceneCenter).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (p->sceneCenter).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  (p->sceneCenter).super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }